

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_dense.c
# Opt level: O0

void SUNDlsMat_denseMatvec
               (sunrealtype **a,sunrealtype *x,sunrealtype *y,sunindextype m,sunindextype n)

{
  sunrealtype *psVar1;
  sunrealtype *col_j;
  sunindextype j;
  sunindextype i;
  sunindextype n_local;
  sunindextype m_local;
  sunrealtype *y_local;
  sunrealtype *x_local;
  sunrealtype **a_local;
  
  for (i = 0; i < m; i = i + 1) {
    y[i] = 0.0;
  }
  for (j = 0; j < n; j = j + 1) {
    psVar1 = a[j];
    for (i = 0; i < m; i = i + 1) {
      y[i] = psVar1[i] * x[j] + y[i];
    }
  }
  return;
}

Assistant:

void SUNDlsMat_denseMatvec(sunrealtype** a, sunrealtype* x, sunrealtype* y,
                           sunindextype m, sunindextype n)
{
  sunindextype i, j;
  sunrealtype* col_j;

  for (i = 0; i < m; i++) { y[i] = ZERO; }

  for (j = 0; j < n; j++)
  {
    col_j = a[j];
    for (i = 0; i < m; i++) { y[i] += col_j[i] * x[j]; }
  }
}